

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printTestCaseAndSectionHeader(ConsoleReporter *this)

{
  ColourImpl *pCVar1;
  pointer pSVar2;
  ostream *poVar3;
  pointer pSVar4;
  long lVar5;
  SourceLineInfo lineInfo;
  char local_39;
  SourceLineInfo local_38;
  
  printOpenHeader(this,&((this->super_StreamingReporterBase).currentTestCaseInfo)->name);
  if (1 < (ulong)(((long)(this->super_StreamingReporterBase).m_sectionStack.
                         super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->super_StreamingReporterBase).m_sectionStack.
                         super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555)) {
    pCVar1 = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
    (*pCVar1->_vptr_ColourImpl[2])(pCVar1,1);
    pSVar4 = (this->super_StreamingReporterBase).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar2 = (this->super_StreamingReporterBase).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while (pSVar4 = pSVar4 + 1, pSVar4 != pSVar2) {
      printHeaderString(this,&pSVar4->name,2);
    }
    (*pCVar1->_vptr_ColourImpl[2])(pCVar1,0);
  }
  pSVar4 = (this->super_StreamingReporterBase).m_sectionStack.
           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_38.file = pSVar4[-1].lineInfo.file;
  local_38.line = pSVar4[-1].lineInfo.line;
  poVar3 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
  lVar5 = 0x4f;
  do {
    std::ostream::put((char)poVar3);
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  local_39 = '\n';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_39,1);
  pCVar1 = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
  (*pCVar1->_vptr_ColourImpl[2])(pCVar1,0x17);
  operator<<(poVar3,&local_38);
  local_39 = '\n';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_39,1);
  lVar5 = 0x4f;
  do {
    std::ostream::put((char)poVar3);
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n\n",2);
  std::ostream::flush();
  (*pCVar1->_vptr_ColourImpl[2])(pCVar1,0);
  return;
}

Assistant:

void ConsoleReporter::printTestCaseAndSectionHeader() {
    assert(!m_sectionStack.empty());
    printOpenHeader(currentTestCaseInfo->name);

    if (m_sectionStack.size() > 1) {
        auto guard = m_colour->guardColour( Colour::Headers ).engage( m_stream );

        auto
            it = m_sectionStack.begin() + 1, // Skip first section (test case)
            itEnd = m_sectionStack.end();
        for (; it != itEnd; ++it)
            printHeaderString(it->name, 2);
    }

    SourceLineInfo lineInfo = m_sectionStack.back().lineInfo;


    m_stream << lineOfChars( '-' ) << '\n'
             << m_colour->guardColour( Colour::FileName ) << lineInfo << '\n'
             << lineOfChars( '.' ) << "\n\n"
             << std::flush;
}